

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

TriangleMesh *
pbrt::Triangle::CreateMesh
          (Transform *renderFromObject,bool reverseOrientation,ParameterDictionary *parameters,
          FileLoc *loc,Allocator alloc)

{
  initializer_list<int> __l;
  initializer_list<pbrt::Point2<float>_> __l_00;
  initializer_list<pbrt::Vector3<float>_> __l_01;
  initializer_list<pbrt::Normal3<float>_> __l_02;
  initializer_list<int> __l_03;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  FileLoc *pFVar5;
  reference pvVar6;
  polymorphic_allocator<std::byte> *ppVar7;
  iterator in_RCX;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *in_RDX;
  byte in_SIL;
  vector<int,_std::allocator<int>_> faceIndices;
  size_t i;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> N;
  vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> S;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> uvs;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> P;
  vector<int,_std::allocator<int>_> vi;
  char *in_stack_fffffffffffffce8;
  string *in_stack_fffffffffffffcf0;
  ParameterDictionary *in_stack_fffffffffffffcf8;
  TriangleMesh *in_stack_fffffffffffffd00;
  iterator in_stack_fffffffffffffd08;
  vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *in_stack_fffffffffffffd10;
  allocator<char> *in_stack_fffffffffffffd20;
  allocator<char> *__a;
  bool *in_stack_fffffffffffffd28;
  Transform *in_stack_fffffffffffffd30;
  polymorphic_allocator<std::byte> *in_stack_fffffffffffffd38;
  FileLoc *in_stack_fffffffffffffd40;
  FileLoc *loc_00;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *args_5;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *args_6;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd60;
  initializer_list<int> local_240;
  undefined4 local_22c;
  undefined4 local_228;
  allocator<char> local_221;
  string local_220 [32];
  vector<int,_std::allocator<int>_> local_200;
  undefined4 local_1e4;
  FileLoc *local_1e0;
  initializer_list<pbrt::Normal3<float>_> local_1d8;
  undefined1 local_1c1 [33];
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> local_1a0;
  initializer_list<pbrt::Vector3<float>_> local_188;
  allocator<char> local_171;
  string local_170 [32];
  vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> local_150;
  initializer_list<pbrt::Point2<float>_> local_138;
  int local_128;
  undefined4 local_124;
  undefined4 local_120;
  undefined4 local_11c;
  undefined4 local_118;
  undefined4 local_114;
  undefined4 *local_110;
  undefined8 local_108;
  allocator<char> local_f9;
  string local_f8 [32];
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> local_d8;
  allocator<char> local_b9;
  string local_b8 [32];
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> local_98;
  allocator<char> local_69;
  string local_68 [32];
  vector<int,_std::allocator<int>_> local_48;
  iterator local_30;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *local_28;
  byte local_19;
  TriangleMesh *local_8;
  
  local_19 = in_SIL & 1;
  local_30 = in_RCX;
  local_28 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  ParameterDictionary::GetIntArray(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  ParameterDictionary::GetPoint3fArray(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  ParameterDictionary::GetPoint2fArray(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  bVar1 = std::vector<int,_std::allocator<int>_>::empty
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd00);
  if (bVar1) {
    sVar2 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size(&local_98)
    ;
    if (sVar2 != 3) {
      Error((FileLoc *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      local_8 = (TriangleMesh *)0x0;
      local_120 = 1;
      goto LAB_0078fa5d;
    }
    local_11c = 0;
    local_118 = 1;
    local_114 = 2;
    local_110 = &local_11c;
    local_108 = 3;
    __l._M_len = (size_type)in_stack_fffffffffffffd10;
    __l._M_array = (iterator)in_stack_fffffffffffffd08;
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd00,__l);
  }
  else {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_48);
    if (sVar2 % 3 != 0) {
      sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_48);
      local_124 = (undefined4)sVar2;
      sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_48);
      local_128 = (int)sVar2 + (int)(sVar2 / 3) * -3;
      Error<int,int>(in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38,
                     (int *)in_stack_fffffffffffffd30,(int *)in_stack_fffffffffffffd28);
      while (sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_48), sVar2 % 3 != 0) {
        std::vector<int,_std::allocator<int>_>::pop_back
                  ((vector<int,_std::allocator<int>_> *)0x78f341);
      }
    }
  }
  bVar1 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::empty
                    ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                     in_stack_fffffffffffffd00);
  if (bVar1) {
    Error((FileLoc *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    local_8 = (TriangleMesh *)0x0;
    local_120 = 1;
  }
  else {
    bVar1 = std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::empty
                      ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
                       in_stack_fffffffffffffd00);
    if (!bVar1) {
      sVar2 = std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::size
                        (&local_d8);
      sVar3 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size
                        (&local_98);
      if (sVar2 != sVar3) {
        Error((FileLoc *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
        std::initializer_list<pbrt::Point2<float>_>::initializer_list(&local_138);
        __l_00._M_len = (size_type)in_stack_fffffffffffffd10;
        __l_00._M_array = (iterator)in_stack_fffffffffffffd08;
        std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::operator=
                  ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
                   in_stack_fffffffffffffd00,__l_00);
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
    ParameterDictionary::GetVector3fArray(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
    std::__cxx11::string::~string(local_170);
    std::allocator<char>::~allocator(&local_171);
    bVar1 = std::vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>::empty
                      ((vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *)
                       in_stack_fffffffffffffd00);
    if (!bVar1) {
      in_stack_fffffffffffffd60 =
           (vector<int,_std::allocator<int>_> *)
           std::vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>::size
                     (&local_150);
      pvVar4 = (vector<int,_std::allocator<int>_> *)
               std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size
                         (&local_98);
      if (in_stack_fffffffffffffd60 != pvVar4) {
        Error((FileLoc *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
        std::initializer_list<pbrt::Vector3<float>_>::initializer_list(&local_188);
        __l_01._M_len = (size_type)in_stack_fffffffffffffd10;
        __l_01._M_array = (iterator)in_stack_fffffffffffffd08;
        std::vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>::operator=
                  ((vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *)
                   in_stack_fffffffffffffd00,__l_01);
      }
    }
    args_6 = (vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)local_1c1;
    args_5 = local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
    ParameterDictionary::GetNormal3fArray(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
    std::__cxx11::string::~string((string *)(local_1c1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1c1);
    bVar1 = std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::empty
                      ((vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)
                       in_stack_fffffffffffffd00);
    if (!bVar1) {
      sVar2 = std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::size
                        (&local_1a0);
      sVar3 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size
                        (&local_98);
      if (sVar2 != sVar3) {
        Error((FileLoc *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
        std::initializer_list<pbrt::Normal3<float>_>::initializer_list(&local_1d8);
        __l_02._M_len = (size_type)in_stack_fffffffffffffd10;
        __l_02._M_array = in_stack_fffffffffffffd08;
        std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::operator=
                  ((vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)
                   in_stack_fffffffffffffd00,__l_02);
      }
    }
    local_1e0 = (FileLoc *)0x0;
    while (loc_00 = local_1e0,
          pFVar5 = (FileLoc *)std::vector<int,_std::allocator<int>_>::size(&local_48),
          loc_00 < pFVar5) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(size_type)local_1e0);
      in_stack_fffffffffffffd38 = (polymorphic_allocator<std::byte> *)(long)*pvVar6;
      ppVar7 = (polymorphic_allocator<std::byte> *)
               std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size
                         (&local_98);
      if (ppVar7 <= in_stack_fffffffffffffd38) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(size_type)local_1e0);
        sVar2 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size
                          (&local_98);
        local_1e4 = (undefined4)sVar2;
        Error<int&,int>(loc_00,(char *)in_stack_fffffffffffffd38,pvVar6,local_30);
        local_8 = (TriangleMesh *)0x0;
        local_120 = 1;
        goto LAB_0078fa25;
      }
      local_1e0 = (FileLoc *)((long)&(local_1e0->filename)._M_len + 1);
    }
    __a = &local_221;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,__a);
    ParameterDictionary::GetIntArray(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator(&local_221);
    bVar1 = std::vector<int,_std::allocator<int>_>::empty
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd00);
    if (!bVar1) {
      in_stack_fffffffffffffd10 =
           (vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *)
           std::vector<int,_std::allocator<int>_>::size(&local_200);
      sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_48);
      if (in_stack_fffffffffffffd10 !=
          (vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *)(sVar2 / 3)) {
        sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_200);
        local_228 = (undefined4)sVar2;
        sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_48);
        local_22c = (undefined4)(sVar2 / 3);
        Error<int,int>(loc_00,(char *)in_stack_fffffffffffffd38,(int *)in_stack_fffffffffffffd30,
                       (int *)in_stack_fffffffffffffd28);
        std::initializer_list<int>::initializer_list(&local_240);
        __l_03._M_len = (size_type)in_stack_fffffffffffffd10;
        __l_03._M_array = local_30;
        std::vector<int,_std::allocator<int>_>::operator=
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd00,__l_03);
      }
    }
    in_stack_fffffffffffffd00 =
         pstd::pmr::polymorphic_allocator<std::byte>::
         new_object<pbrt::TriangleMesh,pbrt::Transform_const&,bool&,std::vector<int,std::allocator<int>>,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>,std::vector<pbrt::Vector3<float>,std::allocator<pbrt::Vector3<float>>>,std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>,std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>,std::vector<int,std::allocator<int>>>
                   (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                    (vector<int,_std::allocator<int>_> *)__a,
                    (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)local_28,
                    in_stack_fffffffffffffd10,args_5,args_6,in_stack_fffffffffffffd60);
    local_120 = 1;
    local_8 = in_stack_fffffffffffffd00;
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd00);
LAB_0078fa25:
    std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::~vector
              ((vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)
               in_stack_fffffffffffffd00);
    std::vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>::~vector
              ((vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *)
               in_stack_fffffffffffffd00);
  }
LAB_0078fa5d:
  std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::~vector
            ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
             in_stack_fffffffffffffd00);
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::~vector
            ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
             in_stack_fffffffffffffd00);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd00);
  return local_8;
}

Assistant:

TriangleMesh *Triangle::CreateMesh(const Transform *renderFromObject,
                                   bool reverseOrientation,
                                   const ParameterDictionary &parameters,
                                   const FileLoc *loc, Allocator alloc) {
    std::vector<int> vi = parameters.GetIntArray("indices");
    std::vector<Point3f> P = parameters.GetPoint3fArray("P");
    std::vector<Point2f> uvs = parameters.GetPoint2fArray("uv");

    if (vi.empty()) {
        if (P.size() == 3)
            vi = {0, 1, 2};
        else {
            Error(loc, "Vertex indices \"indices\" must be provided with "
                       "triangle mesh.");
            return {};
        }
    } else if ((vi.size() % 3) != 0u) {
        Error(loc,
              "Number of vertex indices %d not a multiple of 3. Discarding %d "
              "excess.",
              int(vi.size()), int(vi.size() % 3));
        while ((vi.size() % 3) != 0u)
            vi.pop_back();
    }

    if (P.empty()) {
        Error(loc, "Vertex positions \"P\" must be provided with triangle mesh.");
        return {};
    }

    if (!uvs.empty() && uvs.size() != P.size()) {
        Error(loc, "Number of \"uv\"s for triangle mesh must match \"P\"s. "
                   "Discarding uvs.");
        uvs = {};
    }

    std::vector<Vector3f> S = parameters.GetVector3fArray("S");
    if (!S.empty() && S.size() != P.size()) {
        Error(loc, "Number of \"S\"s for triangle mesh must match \"P\"s. "
                   "Discarding \"S\"s.");
        S = {};
    }
    std::vector<Normal3f> N = parameters.GetNormal3fArray("N");
    if (!N.empty() && N.size() != P.size()) {
        Error(loc, "Number of \"N\"s for triangle mesh must match \"P\"s. "
                   "Discarding \"N\"s.");
        N = {};
    }

    for (size_t i = 0; i < vi.size(); ++i)
        if (vi[i] >= P.size()) {
            Error(loc,
                  "trianglemesh has out of-bounds vertex index %d (%d \"P\" "
                  "values were given. Discarding this mesh.",
                  vi[i], (int)P.size());
            return {};
        }

    std::vector<int> faceIndices = parameters.GetIntArray("faceIndices");
    if (!faceIndices.empty() && faceIndices.size() != vi.size() / 3) {
        Error(loc,
              "Number of face indices %d does not match number of triangles %d. "
              "Discarding face indices.",
              int(faceIndices.size()), int(vi.size() / 3));
        faceIndices = {};
    }

    return alloc.new_object<TriangleMesh>(
        *renderFromObject, reverseOrientation, std::move(vi), std::move(P), std::move(S),
        std::move(N), std::move(uvs), std::move(faceIndices));
}